

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_alloc.h
# Opt level: O1

void free_thread_data(AV1_PRIMARY *ppi)

{
  uint8_t **ppuVar1;
  uint8_t uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  EncWorkerData *pEVar6;
  ThreadData *td;
  int y;
  int num_planes;
  long lVar7;
  long lVar8;
  uint32_t *(*papuVar9) [2];
  long lVar10;
  bool bVar11;
  
  if (1 < (ppi->p_mt_info).num_workers) {
    num_planes = (uint)((ppi->seq_params).monochrome == '\0') * 2 + 1;
    iVar3 = (ppi->p_mt_info).num_mod_workers[2];
    iVar4 = (ppi->p_mt_info).num_workers;
    if (iVar4 <= iVar3) {
      iVar3 = iVar4;
    }
    iVar5 = (ppi->p_mt_info).num_mod_workers[1];
    if (iVar5 < iVar4) {
      iVar4 = iVar5;
    }
    uVar2 = (ppi->seq_params).use_highbitdepth;
    lVar10 = 1;
    do {
      pEVar6 = (ppi->p_mt_info).tile_thr_data;
      td = pEVar6[lVar10].original_td;
      pEVar6[lVar10].td = td;
      if (td != (ThreadData *)0x0) {
        aom_free(td->tctx);
        aom_free(td->palette_buffer);
        aom_free(td->tmp_conv_dst);
        aom_free((td->comp_rd_buffer).pred0);
        aom_free((td->comp_rd_buffer).pred1);
        aom_free((td->comp_rd_buffer).residual1);
        aom_free((td->comp_rd_buffer).diff10);
        aom_free((td->comp_rd_buffer).tmp_best_mask_buf);
        (td->comp_rd_buffer).residual1 = (int16_t *)0x0;
        (td->comp_rd_buffer).diff10 = (int16_t *)0x0;
        (td->comp_rd_buffer).pred0 = (uint8_t *)0x0;
        (td->comp_rd_buffer).pred1 = (uint8_t *)0x0;
        (td->comp_rd_buffer).tmp_best_mask_buf = (uint8_t *)0x0;
        lVar8 = 0x4ba7;
        do {
          aom_free((&(td->mb).plane[0].src_diff)[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 == 0x4ba8);
        aom_free(td->pixel_gradient_info);
        aom_free(td->src_var_info_of_4x4_sub_blocks);
        aom_free((td->obmc_buffer).mask);
        aom_free((td->obmc_buffer).above_pred);
        aom_free((td->obmc_buffer).left_pred);
        aom_free((td->obmc_buffer).wsrc);
        (td->obmc_buffer).above_pred = (uint8_t *)0x0;
        (td->obmc_buffer).left_pred = (uint8_t *)0x0;
        (td->obmc_buffer).wsrc = (int32_t *)0x0;
        (td->obmc_buffer).mask = (int32_t *)0x0;
        aom_free(td->vt64x64);
        papuVar9 = td->hash_value_buffer;
        lVar8 = 0;
        do {
          lVar7 = 0;
          do {
            aom_free((*papuVar9)[lVar7]);
            (*papuVar9)[lVar7] = (uint32_t *)0x0;
            lVar7 = lVar7 + 1;
          } while (lVar7 == 1);
          papuVar9 = papuVar9 + 1;
          bVar11 = lVar8 == 0;
          lVar8 = lVar8 + 1;
        } while (bVar11);
        aom_free(td->mv_costs_alloc);
        td->mv_costs_alloc = (MvCosts *)0x0;
        aom_free(td->dv_costs_alloc);
        td->dv_costs_alloc = (IntraBCMVCosts *)0x0;
        aom_free(td->counts);
        av1_free_pmc(td->firstpass_ctx,num_planes);
        td->firstpass_ctx = (PICK_MODE_CONTEXT *)0x0;
        av1_free_shared_coeff_buffer(&td->shared_coeff_buf);
        av1_free_sms_tree(td);
        if (lVar10 < iVar4) {
          if (uVar2 != '\0') {
            ppuVar1 = &(td->tf_data).pred;
            *ppuVar1 = (uint8_t *)((long)*ppuVar1 << 1);
          }
          aom_free((td->tf_data).tmp_mbmi);
          (td->tf_data).tmp_mbmi = (MB_MODE_INFO *)0x0;
          aom_free((td->tf_data).accum);
          (td->tf_data).accum = (uint32_t *)0x0;
          aom_free((td->tf_data).count);
          (td->tf_data).count = (uint16_t *)0x0;
          aom_free((td->tf_data).pred);
          (td->tf_data).pred = (uint8_t *)0x0;
        }
        if (lVar10 < iVar3) {
          aom_free((td->tpl_tmp_buffers).predictor8);
          (td->tpl_tmp_buffers).predictor8 = (uint8_t *)0x0;
          aom_free((td->tpl_tmp_buffers).src_diff);
          (td->tpl_tmp_buffers).src_diff = (int16_t *)0x0;
          aom_free((td->tpl_tmp_buffers).coeff);
          (td->tpl_tmp_buffers).coeff = (tran_low_t *)0x0;
          aom_free((td->tpl_tmp_buffers).qcoeff);
          (td->tpl_tmp_buffers).qcoeff = (tran_low_t *)0x0;
          aom_free((td->tpl_tmp_buffers).dqcoeff);
          (td->tpl_tmp_buffers).dqcoeff = (tran_low_t *)0x0;
        }
        aom_free((td->gm_data).segment_map);
        (td->gm_data).segment_map = (uint8_t *)0x0;
        aom_free((td->gm_data).motion_models[0].inliers);
        (td->gm_data).motion_models[0].inliers = (int *)0x0;
        aom_free((td->mb).txfm_search_info.mb_rd_record);
        (td->mb).txfm_search_info.mb_rd_record = (MB_RD_RECORD *)0x0;
        aom_free((td->mb).inter_modes_info);
        (td->mb).inter_modes_info = (inter_modes_info *)0x0;
        av1_dealloc_src_diff_buf(&td->mb,num_planes);
        aom_free((td->mb).e_mbd.seg_mask);
        (td->mb).e_mbd.seg_mask = (uint8_t *)0x0;
        aom_free((td->mb).winner_mode_stats);
        (td->mb).winner_mode_stats = (WinnerModeStats *)0x0;
        aom_free((td->mb).dqcoeff_buf);
        (td->mb).dqcoeff_buf = (tran_low_t *)0x0;
        aom_free((td->mb).sb_stats_cache);
        (td->mb).sb_stats_cache = (SB_FIRST_PASS_STATS *)0x0;
        aom_free((td->mb).sb_fp_stats);
        (td->mb).sb_fp_stats = (SB_FIRST_PASS_STATS *)0x0;
        av1_free_pc_tree_recursive(td->pc_root,num_planes,0,0,'\0');
        td->pc_root = (PC_TREE *)0x0;
        av1_dealloc_mb_wiener_var_pred_buf(td);
        aom_free(td);
        pEVar6[lVar10].td = (ThreadData *)0x0;
        pEVar6[lVar10].original_td = (ThreadData *)0x0;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (ppi->p_mt_info).num_workers);
  }
  return;
}

Assistant:

static inline void free_thread_data(AV1_PRIMARY *ppi) {
  PrimaryMultiThreadInfo *const p_mt_info = &ppi->p_mt_info;
  const int num_tf_workers =
      AOMMIN(p_mt_info->num_mod_workers[MOD_TF], p_mt_info->num_workers);
  const int num_tpl_workers =
      AOMMIN(p_mt_info->num_mod_workers[MOD_TPL], p_mt_info->num_workers);
  const int is_highbitdepth = ppi->seq_params.use_highbitdepth;
  const int num_planes = ppi->seq_params.monochrome ? 1 : MAX_MB_PLANE;
  for (int t = 1; t < p_mt_info->num_workers; ++t) {
    EncWorkerData *const thread_data = &p_mt_info->tile_thr_data[t];
    thread_data->td = thread_data->original_td;
    ThreadData *const td = thread_data->td;
    if (!td) continue;
    aom_free(td->tctx);
    aom_free(td->palette_buffer);
    aom_free(td->tmp_conv_dst);
    release_compound_type_rd_buffers(&td->comp_rd_buffer);
    for (int j = 0; j < 2; ++j) {
      aom_free(td->tmp_pred_bufs[j]);
    }
    aom_free(td->pixel_gradient_info);
    aom_free(td->src_var_info_of_4x4_sub_blocks);
    release_obmc_buffers(&td->obmc_buffer);
    aom_free(td->vt64x64);

    for (int x = 0; x < 2; x++) {
      for (int y = 0; y < 2; y++) {
        aom_free(td->hash_value_buffer[x][y]);
        td->hash_value_buffer[x][y] = NULL;
      }
    }
    aom_free(td->mv_costs_alloc);
    td->mv_costs_alloc = NULL;
    aom_free(td->dv_costs_alloc);
    td->dv_costs_alloc = NULL;
    aom_free(td->counts);
    av1_free_pmc(td->firstpass_ctx, num_planes);
    td->firstpass_ctx = NULL;
    av1_free_shared_coeff_buffer(&td->shared_coeff_buf);
    av1_free_sms_tree(td);
    // This call ensures that the buffers allocated by tf_alloc_and_reset_data()
    // in prepare_tf_workers() for MT encode are freed in case an error is
    // encountered during temporal filtering (due to early termination
    // tf_dealloc_thread_data() in av1_tf_do_filtering_mt() would not be
    // invoked).
    if (t < num_tf_workers) tf_dealloc_data(&td->tf_data, is_highbitdepth);
    // This call ensures that tpl_tmp_buffers for MT encode are freed in case of
    // an error during tpl.
    if (t < num_tpl_workers) tpl_dealloc_temp_buffers(&td->tpl_tmp_buffers);
    // This call ensures that the buffers in gm_data for MT encode are freed in
    // case of an error during gm.
    gm_dealloc_data(&td->gm_data);
    av1_dealloc_mb_data(&td->mb, num_planes);
    aom_free(td->mb.sb_stats_cache);
    td->mb.sb_stats_cache = NULL;
    aom_free(td->mb.sb_fp_stats);
    td->mb.sb_fp_stats = NULL;
#if CONFIG_PARTITION_SEARCH_ORDER
    aom_free(td->mb.rdcost);
    td->mb.rdcost = NULL;
#endif
    av1_free_pc_tree_recursive(td->pc_root, num_planes, 0, 0, SEARCH_PARTITION);
    td->pc_root = NULL;
    av1_dealloc_mb_wiener_var_pred_buf(td);
    aom_free(td);
    thread_data->td = NULL;
    thread_data->original_td = NULL;
  }
}